

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O0

Vector2D __thiscall CGL::UniformGridSampler2D::get_sample(UniformGridSampler2D *this)

{
  Vector2D *in_RDI;
  double x;
  double y;
  Vector2D VVar1;
  
  x = random_uniform();
  y = random_uniform();
  Vector2D::Vector2D(in_RDI,x,y);
  VVar1.y = y;
  VVar1.x = x;
  return VVar1;
}

Assistant:

Vector2D UniformGridSampler2D::get_sample() const {

  return Vector2D(random_uniform(), random_uniform());

}